

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Abc_Obj_t *
Abc_NodeFromMapSuperChoice_rec
          (Abc_Ntk_t *pNtkNew,Map_Super_t *pSuper,Abc_Obj_t **pNodePis,int nNodePis)

{
  Mem_Flex_t *pMan;
  int iVar1;
  Mio_Library_t *pLib_00;
  Mio_Gate_t *pMVar2;
  char *pcVar3;
  Map_Super_t **ppMVar4;
  Abc_Obj_t *pFanin;
  int local_64;
  int i;
  int Number;
  int nFanins;
  Abc_Obj_t *pNodeFanin;
  Abc_Obj_t *pNodeNew;
  Map_Super_t **ppFanins;
  Mio_Gate_t *pRoot;
  Mio_Library_t *pLib;
  int nNodePis_local;
  Abc_Obj_t **pNodePis_local;
  Map_Super_t *pSuper_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  pMVar2 = Map_SuperReadRoot(pSuper);
  if (pMVar2 == (Mio_Gate_t *)0x0) {
    iVar1 = Map_SuperReadNum(pSuper);
    if (iVar1 < nNodePis) {
      pNtkNew_local = (Abc_Ntk_t *)pNodePis[iVar1];
    }
    else {
      pNtkNew_local = (Abc_Ntk_t *)Abc_NtkCreateNodeConst0(pNtkNew);
    }
  }
  else {
    pcVar3 = Mio_GateReadName(pMVar2);
    pMVar2 = Mio_LibraryReadGateByName(pLib_00,pcVar3,(char *)0x0);
    iVar1 = Map_SuperReadFaninNum(pSuper);
    ppMVar4 = Map_SuperReadFanins(pSuper);
    pNtkNew_local = (Abc_Ntk_t *)Abc_NtkCreateNode(pNtkNew);
    for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
      pFanin = Abc_NodeFromMapSuperChoice_rec(pNtkNew,ppMVar4[local_64],pNodePis,nNodePis);
      Abc_ObjAddFanin((Abc_Obj_t *)pNtkNew_local,pFanin);
    }
    pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    pcVar3 = Mio_GateReadSop(pMVar2);
    pcVar3 = Abc_SopRegister(pMan,pcVar3);
    ((anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)&pNtkNew_local->vCis)->pData = pcVar3;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMapSuperChoice_rec( Abc_Ntk_t * pNtkNew, Map_Super_t * pSuper, Abc_Obj_t * pNodePis[], int nNodePis )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_Gate_t * pRoot;
    Map_Super_t ** ppFanins;
    Abc_Obj_t * pNodeNew, * pNodeFanin;
    int nFanins, Number, i;

    // get the parameters of the supergate
    pRoot = Map_SuperReadRoot(pSuper);
    if ( pRoot == NULL )
    {
        Number = Map_SuperReadNum(pSuper);
        if ( Number < nNodePis )  
        {
            return pNodePis[Number];
        }
        else
        {  
//            assert( 0 );
            /* It might happen that a super gate with 5 inputs is constructed that
             * actually depends only on the first four variables; i.e the fifth is a
             * don't care -- in that case we connect constant node for the fifth
             * (since the cut only has 4 variables). An interesting question is what
             * if the first variable (and not the fifth one is the redundant one;
             * can that happen?) */
            return Abc_NtkCreateNodeConst0(pNtkNew);
        }
    }
    pRoot = Mio_LibraryReadGateByName( pLib, Mio_GateReadName(pRoot), NULL );

    // get information about the fanins of the supergate
    nFanins  = Map_SuperReadFaninNum( pSuper );
    ppFanins = Map_SuperReadFanins( pSuper );
    // create a new node with these fanins
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < nFanins; i++ )
    {
        pNodeFanin = Abc_NodeFromMapSuperChoice_rec( pNtkNew, ppFanins[i], pNodePis, nNodePis );
        Abc_ObjAddFanin( pNodeNew, pNodeFanin );
    }
    pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Mio_GateReadSop(pRoot) );
    return pNodeNew;
}